

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

void CObject::PrintLog2(char *pFMT,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 local_28;
  undefined4 local_24;
  va_list argptr;
  char *pFMT_local;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (m_pLog != (FILE *)0x0) {
    argptr[0].overflow_arg_area = local_d8;
    argptr[0]._0_8_ = &stack0x00000008;
    local_24 = 0x30;
    local_28 = 8;
    local_d0 = in_RSI;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    argptr[0].reg_save_area = pFMT;
    vfprintf((FILE *)m_pLog,pFMT,&local_28);
    fflush((FILE *)m_pLog);
  }
  return;
}

Assistant:

void CObject::PrintLog2(char *pFMT, ...)
{
	if(m_pLog)
	{
		va_list argptr;	
		va_start(argptr, pFMT);
		vfprintf(m_pLog,pFMT, argptr);
		va_end(argptr);

		fflush(m_pLog);
	}
}